

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O1

void __thiscall
TPZParFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::
TPZParFrontStructMatrix
          (TPZParFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> *this
          ,TPZCompMesh *mesh)

{
  undefined8 *puVar1;
  
  *(undefined8 *)&this->field_0x258 = 0x19f6b98;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19f6c60;
  *(undefined4 *)&this->field_0x260 = 0;
  this->field_0x264 = 1;
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)this,&PTR_construction_vtable_104__019f3548,mesh);
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19f6590;
  *(undefined8 *)&this->field_0x258 = 0x19f6670;
  TPZStructMatrixOR<double>::TPZStructMatrixOR
            ((TPZStructMatrixOR<double> *)
             &(this->
              super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>
              ).super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0,
             &PTR_construction_vtable_104__019f3570);
  *(undefined ***)
   &(this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa8 = &PTR__TPZVec_0183b5b0;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>).
    field_0xb0 = 0;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>).
    field_0xb8 = 0;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>).
    field_0xc0 = 0;
  (this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>).
  f_quiet = 0;
  (this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>).
  fDecomposeType = ENoDecompose;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19f32d8;
  *(undefined8 *)&this->field_0x258 = 0x19f34c0;
  *(undefined8 *)
   &(this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x19f33c0;
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 1) = 0;
  LOCK();
  *(undefined4 *)(puVar1 + 1) = 1;
  UNLOCK();
  *(undefined8 **)
   &(this->super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>).
    field_0xd0 = puVar1;
  TPZStack<long,_10>::TPZStack(&this->felnum);
  TPZVec<TPZElementMatrix_*>::TPZVec((TPZVec<TPZElementMatrix_*> *)&this->fekstack,0);
  (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fStore = (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.fExtAlloc;
  (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fNElements = 0;
  (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fNAlloc = 0;
  (this->fekstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019fdad0;
  TPZVec<TPZElementMatrix_*>::TPZVec((TPZVec<TPZElementMatrix_*> *)&this->fefstack,0);
  (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fStore = (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.fExtAlloc;
  (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fNElements = 0;
  (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  fNAlloc = 0;
  (this->fefstack).super_TPZManVector<TPZElementMatrix_*,_10>.super_TPZVec<TPZElementMatrix_*>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_019fdad0;
  this->fMaxStackSize = 500;
  *(undefined4 *)
   ((long)&(this->
           super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>).
           super_TPZStructMatrixT<double>.super_TPZStructMatrix.fMesh +
   *(long *)(*(long *)&(this->
                       super_TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>
                       ).super_TPZStructMatrixT<double>.super_TPZStructMatrix + -0x60)) = 3;
  return;
}

Assistant:

TPZParFrontStructMatrix<TFront,TVar,TPar>::TPZParFrontStructMatrix(TPZCompMesh *mesh): TPZFrontStructMatrix<TFront,TVar,TPar>(mesh)
{
	fMaxStackSize = 500;
	TPZStructMatrix::SetNumThreads(3);
}